

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

InterfaceHandle __thiscall helics::CommonCore::getTranslator(CommonCore *this,string_view name)

{
  BasicHandleInfo *this_00;
  ordered_guarded<helics::HandleManager,_std::shared_mutex> *unaff_retaddr;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *trans;
  undefined4 in_stack_fffffffffffffff8;
  InterfaceHandle in_stack_fffffffffffffffc;
  
  this_00 = (BasicHandleInfo *)
            gmlc::libguarded::ordered_guarded<helics::HandleManager,std::shared_mutex>::
            read<helics::CommonCore::getTranslator(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                      (unaff_retaddr,
                       (anon_class_8_1_898f2789 *)
                       CONCAT44(in_stack_fffffffffffffffc.hid,in_stack_fffffffffffffff8));
  if ((this_00 == (BasicHandleInfo *)0x0) || (this_00->handleType != TRANSLATOR)) {
    memset(&stack0xfffffffffffffffc,0,4);
    InterfaceHandle::InterfaceHandle((InterfaceHandle *)&stack0xfffffffffffffffc);
  }
  else {
    in_stack_fffffffffffffffc = BasicHandleInfo::getInterfaceHandle(this_00);
  }
  return (InterfaceHandle)in_stack_fffffffffffffffc.hid;
}

Assistant:

InterfaceHandle CommonCore::getTranslator(std::string_view name) const
{
    const auto* trans = handles.read(
        [&name](auto& hand) { return hand.getInterfaceHandle(name, InterfaceType::TRANSLATOR); });
    if ((trans != nullptr) && (trans->handleType == InterfaceType::TRANSLATOR)) {
        return trans->getInterfaceHandle();
    }
    return {};
}